

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ons_test.cc
# Opt level: O0

int test_ons_trend_topic_input_tps(void)

{
  code *pcVar1;
  char *__s;
  Ons *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_261;
  int ret;
  HttpTestListener *local_240;
  HttpTestListener *listener;
  string local_230;
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [55];
  allocator<char> local_1a9;
  string local_1a8 [32];
  Ons *local_188;
  Ons *ons;
  OnsOnsTrendTopicInputTpsResponseType resp;
  OnsOnsTrendTopicInputTpsRequestType req;
  
  aliyun::OnsOnsTrendTopicInputTpsRequestType::OnsOnsTrendTopicInputTpsRequestType
            ((OnsOnsTrendTopicInputTpsRequestType *)((long)&resp.help_url.field_2 + 8));
  aliyun::OnsOnsTrendTopicInputTpsResponseType::OnsOnsTrendTopicInputTpsResponseType
            ((OnsOnsTrendTopicInputTpsResponseType *)&ons);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"cn-hangzhou",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"my_appid",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"my_secret",&local_209);
  pOVar2 = (Ons *)aliyun::Ons::CreateOnsClient(local_1a8,local_1e0,local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  local_188 = pOVar2;
  if (pOVar2 == (Ons *)0x0) {
    aliyun::OnsOnsTrendTopicInputTpsResponseType::~OnsOnsTrendTopicInputTpsResponseType
              ((OnsOnsTrendTopicInputTpsResponseType *)&ons);
    aliyun::OnsOnsTrendTopicInputTpsRequestType::~OnsOnsTrendTopicInputTpsRequestType
              ((OnsOnsTrendTopicInputTpsRequestType *)((long)&resp.help_url.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetProxyHost(pOVar2,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ons::SetUseTls(local_188,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_ons_trend_topic_input_tps_response;
  local_240 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_261);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_261);
  HttpTestListener::Start(local_240);
  std::__cxx11::string::operator=((string *)(resp.help_url.field_2._M_local_buf + 8),"OnsRegionId");
  std::__cxx11::string::operator=
            ((string *)(req.ons_region_id.field_2._M_local_buf + 8),"OnsPlatform");
  std::__cxx11::string::operator=
            ((string *)(req.ons_platform.field_2._M_local_buf + 8),"PreventCache");
  std::__cxx11::string::operator=((string *)(req.prevent_cache.field_2._M_local_buf + 8),"Topic");
  std::__cxx11::string::operator=((string *)(req.topic.field_2._M_local_buf + 8),"BeginTime");
  std::__cxx11::string::operator=((string *)(req.begin_time.field_2._M_local_buf + 8),"EndTime");
  std::__cxx11::string::operator=((string *)(req.end_time.field_2._M_local_buf + 8),"Period");
  aliyun::Ons::OnsTrendTopicInputTps
            (local_188,(OnsOnsTrendTopicInputTpsRequestType *)((long)&resp.help_url.field_2 + 8),
             (OnsOnsTrendTopicInputTpsResponseType *)&ons,(OnsErrorInfo *)0x0);
  HttpTestListener::WaitComplete(local_240);
  pHVar3 = local_240;
  if (local_240 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_240);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_188;
  if (local_188 != (Ons *)0x0) {
    aliyun::Ons::~Ons(local_188);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_ons_trend_topic_input_tps() {
  OnsOnsTrendTopicInputTpsRequestType req;
  OnsOnsTrendTopicInputTpsResponseType resp;
  Ons* ons = Ons::CreateOnsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ons) return 0;
  ons->SetProxyHost("127.0.0.1:12234");
  ons->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_ons_trend_topic_input_tps_response);
  listener->Start();
  req.ons_region_id = "OnsRegionId";
  req.ons_platform = "OnsPlatform";
  req.prevent_cache = "PreventCache";
  req.topic = "Topic";
  req.begin_time = "BeginTime";
  req.end_time = "EndTime";
  req.period = "Period";
  int ret = ons->OnsTrendTopicInputTps(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ons;
}